

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network_console_conn.cpp
# Opt level: O3

void __thiscall CConsoleNetConnection::Reset(CConsoleNetConnection *this)

{
  this->m_State = 0;
  mem_zero(&this->m_PeerAddr,0x18);
  this->m_aErrorString[0] = '\0';
  (this->m_Socket).type = 0;
  (this->m_Socket).ipv4sock = -1;
  (this->m_Socket).ipv6sock = -1;
  this->m_aBuffer[0] = '\0';
  this->m_BufferOffset = 0;
  this->m_LineEndingDetected = false;
  this->m_aLineEnding[0] = '\n';
  this->m_aLineEnding[1] = '\0';
  this->m_aLineEnding[2] = '\0';
  return;
}

Assistant:

void CConsoleNetConnection::Reset()
{
	m_State = NET_CONNSTATE_OFFLINE;
	mem_zero(&m_PeerAddr, sizeof(m_PeerAddr));
	m_aErrorString[0] = 0;

	m_Socket.type = NETTYPE_INVALID;
	m_Socket.ipv4sock = -1;
	m_Socket.ipv6sock = -1;
	m_aBuffer[0] = 0;
	m_BufferOffset = 0;

	m_LineEndingDetected = false;
	#if defined(CONF_FAMILY_WINDOWS)
		m_aLineEnding[0] = '\r';
		m_aLineEnding[1] = '\n';
		m_aLineEnding[2] = 0;
	#else
		m_aLineEnding[0] = '\n';
		m_aLineEnding[1] = 0;
		m_aLineEnding[2] = 0;
	#endif
}